

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O1

int calculate_button_fringe(Am_Widget_Look look,bool leave_room,bool key_sel,bool def)

{
  int iVar1;
  
  if (look.value == Am_MACINTOSH_LOOK_val) {
    iVar1 = (uint)(def || leave_room) << 3;
  }
  else {
    iVar1 = 0;
    if (look.value != Am_WINDOWS_LOOK_val) {
      if (look.value == Am_MOTIF_LOOK_val) {
        iVar1 = 10;
        if (!def && !leave_room) {
          iVar1 = 0;
        }
        return iVar1 + (uint)(leave_room || key_sel) * 4;
      }
      Am_Error("Unknown Look parameter");
    }
  }
  return iVar1;
}

Assistant:

int
calculate_button_fringe(Am_Widget_Look look, bool leave_room, bool key_sel,
                        bool def)
{
  if (leave_room) {
    key_sel = true;
    def = true;
  }

  int border = 0;
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    border = (key_sel ? 2 * kMotKeySel : 0) + (def ? 2 * kMotDefault : 0);
    break;

  case Am_WINDOWS_LOOK_val:
    border = (key_sel ? 2 * kWinKeySel : 0) + (def ? 2 * kWinDefault : 0);
    break;

  case Am_MACINTOSH_LOOK_val:
    border = (key_sel ? 2 * kMacKeySel : 0) + (def ? 2 * kMacDefault : 0);
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }

  return border;
}